

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::IntTConvertor<unsigned_long>::convert_abi_cxx11_
          (string *__return_storage_ptr__,IntTConvertor<unsigned_long> *this,unsigned_long value)

{
  char *pcVar1;
  allocator local_41;
  char *local_40;
  char *start;
  char buffer [21];
  unsigned_long value_local;
  
  pcVar1 = integer_to_string<unsigned_long>((char *)&start,0x15,(unsigned_long)this);
  local_40 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,pcVar1,(ulong)(buffer + (0xd - (long)pcVar1)),
             &local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(T value) {
    // buffer is big enough for significant digits and extra digit,
    // minus and null
    char buffer[std::numeric_limits<T>::digits10 + 2];
    const char *const start = integer_to_string(buffer, sizeof(buffer), value);
    return std::string(start, buffer + sizeof(buffer) - start);
  }